

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

LpStats * __thiscall Clasp::ClaspFacade::Summary::lpStep(Summary *this)

{
  bool bVar1;
  ProgramBuilder *pPVar2;
  ClaspFacade *in_RDI;
  LpStats *local_18;
  
  bVar1 = isAsp(in_RDI);
  if (bVar1) {
    pPVar2 = program((ClaspFacade *)0x122cae);
    local_18 = (LpStats *)&pPVar2->field_0x1c;
  }
  else {
    local_18 = (LpStats *)0x0;
  }
  return local_18;
}

Assistant:

const Asp::LpStats* ClaspFacade::Summary::lpStep() const {
	return facade->isAsp() ? &static_cast<const Asp::LogicProgram*>(facade->program())->stats : 0;
}